

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O2

PList * p_list_append(PList *list,ppointer data)

{
  PList *pPVar1;
  PList *pPVar2;
  PList *pPVar3;
  
  pPVar2 = (PList *)p_malloc0(0x10);
  if (pPVar2 == (PList *)0x0) {
    printf("** Error: %s **\n","PList::p_list_append: failed to allocate memory");
    pPVar2 = list;
  }
  else {
    pPVar2->data = data;
    pPVar1 = list;
    if (list != (PList *)0x0) {
      do {
        pPVar3 = pPVar1;
        pPVar1 = pPVar3->next;
      } while (pPVar1 != (PList *)0x0);
      pPVar3->next = pPVar2;
      pPVar2 = list;
    }
  }
  return pPVar2;
}

Assistant:

P_LIB_API PList *
p_list_append (PList	*list,
	       ppointer	data)
{
	PList *item;
	PList *cur;

	if (P_UNLIKELY ((item = p_malloc0 (sizeof (PList))) == NULL)) {
		P_ERROR ("PList::p_list_append: failed to allocate memory");
		return list;
	}

	item->data = data;

	/* List is empty */
	if (P_UNLIKELY (list == NULL))
		return item;

	for (cur = list; cur->next != NULL; cur = cur->next)
		;
	cur->next = item;

	return list;
}